

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Interpolator<true>::
Interpolate<unsigned_long,duckdb::hugeint_t,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  RESULT_TYPE RVar1;
  hugeint_t hVar2;
  unsigned_long local_8;
  
  local_8 = lidx;
  RVar1 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_8);
  hVar2.upper = RVar1.upper;
  hVar2.lower = hVar2.upper;
  hVar2 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar1.lower,hVar2);
  return hVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}